

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hud.cpp
# Opt level: O0

void __thiscall CHud::OnMessage(CHud *this,int MsgType,void *pRawMsg)

{
  int64 iVar1;
  undefined4 *in_RDX;
  int in_ESI;
  long in_RDI;
  CNetMsg_Sv_KillMsg *pMsg_1;
  CNetMsg_Sv_Checkpoint *pMsg;
  
  if (in_ESI == 0x24) {
    *(undefined4 *)(in_RDI + 0x28) = *in_RDX;
    iVar1 = time_get();
    *(int64 *)(in_RDI + 0x30) = iVar1;
  }
  else if (((in_ESI == 5) && ((*(uint *)(*(long *)(in_RDI + 8) + 0x1b15c) & 8) != 0)) &&
          (in_RDX[1] == *(int *)(*(long *)(in_RDI + 8) + 0x1b140))) {
    *(undefined8 *)(in_RDI + 0x30) = 0;
  }
  return;
}

Assistant:

void CHud::OnMessage(int MsgType, void *pRawMsg)
{
	if(MsgType == NETMSGTYPE_SV_CHECKPOINT)
	{
		CNetMsg_Sv_Checkpoint *pMsg = (CNetMsg_Sv_Checkpoint *)pRawMsg;
		m_CheckpointDiff = pMsg->m_Diff;
		m_CheckpointTime = time_get();
	}
	else if(MsgType == NETMSGTYPE_SV_KILLMSG && (m_pClient->m_GameInfo.m_GameFlags&GAMEFLAG_RACE))
	{
		// reset checkpoint time on death
		CNetMsg_Sv_KillMsg *pMsg = (CNetMsg_Sv_KillMsg *)pRawMsg;
		if(pMsg->m_Victim == m_pClient->m_LocalClientID)
			m_CheckpointTime = 0;
	}
}